

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatterBase.c
# Opt level: O0

ZyanStatus
ZydisFormatterBaseFormatOperandPTR
          (ZydisFormatter *formatter,ZydisFormatterBuffer *buffer,ZydisFormatterContext *context)

{
  ZyanU8 ZVar1;
  ZyanStatus status_047620348_7;
  ZyanStatus status_047620348_6;
  ZyanStatus status_047620348_5;
  ZyanU8 padding;
  ZyanStatus status_047620348_4;
  ZyanStatus status_047620348_3;
  ZyanStatus status_047620348_2;
  ZyanStatus status_047620348_1;
  ZyanStatus status_047620348;
  ZydisFormatterContext *context_local;
  ZydisFormatterBuffer *buffer_local;
  ZydisFormatter *formatter_local;
  
  if (formatter == (ZydisFormatter *)0x0) {
    __assert_fail("formatter",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterBase.c"
                  ,0xa7,
                  "ZyanStatus ZydisFormatterBaseFormatOperandPTR(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (buffer != (ZydisFormatterBuffer *)0x0) {
    if (context == (ZydisFormatterContext *)0x0) {
      __assert_fail("context",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterBase.c"
                    ,0xa9,
                    "ZyanStatus ZydisFormatterBaseFormatOperandPTR(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                   );
    }
    if ((buffer->is_token_list == '\0') ||
       (formatter_local._4_4_ = ZydisFormatterBufferAppend(buffer,'\v'),
       (formatter_local._4_4_ & 0x80000000) == 0)) {
      if (formatter->addr_base == ZYDIS_NUMERIC_BASE_DEC) {
        formatter_local._4_4_ =
             ZydisStringAppendDecU
                       (&buffer->string,(ulong)(context->operand->field_10).ptr.segment,'\x04',
                        formatter->number_format[formatter->addr_base][0].string,
                        formatter->number_format[formatter->addr_base][1].string);
      }
      else {
        if (formatter->addr_base != ZYDIS_NUMERIC_BASE_HEX) {
          return 0x80100004;
        }
        formatter_local._4_4_ =
             ZydisStringAppendHexU
                       (&buffer->string,(ulong)(context->operand->field_10).ptr.segment,'\x04',
                        formatter->hex_force_leading_number,formatter->hex_uppercase,
                        formatter->number_format[formatter->addr_base][0].string,
                        formatter->number_format[formatter->addr_base][1].string);
      }
      if ((formatter_local._4_4_ & 0x80000000) == 0) {
        if (buffer->is_token_list == '\0') {
          formatter_local._4_4_ = ZydisStringAppendShort(&buffer->string,&STR_DELIM_SEGMENT);
        }
        else {
          formatter_local._4_4_ =
               ZydisFormatterBufferAppendPredefined
                         (buffer,(ZydisPredefinedToken *)&TOK_DATA_DELIM_SEGMENT);
        }
        if ((formatter_local._4_4_ & 0x80000000) == 0) {
          ZVar1 = context->instruction->operand_width;
          if (ZVar1 == '\x10') {
            status_047620348_6._3_1_ = '\x04';
          }
          else {
            if (ZVar1 != ' ') {
              return 0x80100004;
            }
            status_047620348_6._3_1_ = '\b';
          }
          if ((buffer->is_token_list == '\0') ||
             (formatter_local._4_4_ = ZydisFormatterBufferAppend(buffer,'\v'),
             (formatter_local._4_4_ & 0x80000000) == 0)) {
            if (formatter->addr_base == ZYDIS_NUMERIC_BASE_DEC) {
              formatter_local._4_4_ =
                   ZydisStringAppendDecU
                             (&buffer->string,(ulong)(context->operand->field_10).mem.segment,
                              status_047620348_6._3_1_,
                              formatter->number_format[formatter->addr_base][0].string,
                              formatter->number_format[formatter->addr_base][1].string);
            }
            else {
              if (formatter->addr_base != ZYDIS_NUMERIC_BASE_HEX) {
                return 0x80100004;
              }
              formatter_local._4_4_ =
                   ZydisStringAppendHexU
                             (&buffer->string,(ulong)(context->operand->field_10).mem.segment,
                              status_047620348_6._3_1_,formatter->hex_force_leading_number,
                              formatter->hex_uppercase,
                              formatter->number_format[formatter->addr_base][0].string,
                              formatter->number_format[formatter->addr_base][1].string);
            }
            if ((formatter_local._4_4_ & 0x80000000) == 0) {
              formatter_local._4_4_ = 0x100000;
            }
          }
        }
      }
    }
    return formatter_local._4_4_;
  }
  __assert_fail("buffer",
                "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterBase.c"
                ,0xa8,
                "ZyanStatus ZydisFormatterBaseFormatOperandPTR(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
               );
}

Assistant:

ZyanStatus ZydisFormatterBaseFormatOperandPTR(const ZydisFormatter* formatter,
    ZydisFormatterBuffer* buffer, ZydisFormatterContext* context)
{
    ZYAN_ASSERT(formatter);
    ZYAN_ASSERT(buffer);
    ZYAN_ASSERT(context);

    ZYDIS_BUFFER_APPEND_TOKEN(buffer, ZYDIS_TOKEN_IMMEDIATE);
    ZYDIS_STRING_APPEND_NUM_U(formatter, formatter->addr_base, &buffer->string,
        context->operand->ptr.segment, 4, formatter->hex_force_leading_number);
    ZYDIS_BUFFER_APPEND(buffer, DELIM_SEGMENT);

    ZyanU8 padding;
    switch (context->instruction->operand_width)
    {
    case 16:
        padding = 4;
        break;
    case 32:
        padding = 8;
        break;
    default:
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }

    ZYDIS_BUFFER_APPEND_TOKEN(buffer, ZYDIS_TOKEN_IMMEDIATE);
    ZYDIS_STRING_APPEND_NUM_U(formatter, formatter->addr_base, &buffer->string,
        context->operand->ptr.offset , padding, formatter->hex_force_leading_number);

    return ZYAN_STATUS_SUCCESS;
}